

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O3

void __thiscall xemmai::t_thread::f_join(t_thread *this)

{
  t_engine *this_00;
  wchar_t *in_RDX;
  t_engine *p;
  long in_FS_OFFSET;
  wstring_view a_message;
  wstring_view a_message_00;
  t_safe_region region;
  unique_lock<std::mutex> lock;
  t_safe_region local_29;
  unique_lock<std::mutex> local_28;
  
  if (this->v_internal == *(t_internal **)(in_FS_OFFSET + -0x28)) {
    a_message._M_str = in_RDX;
    a_message._M_len = (size_t)L"current thread can not be joined.";
    f_throw((xemmai *)0x21,a_message);
  }
  this_00 = *(t_engine **)(in_FS_OFFSET + -0x60);
  if ((t_thread *)((this_00->v_thread).super_t_slot.v_p._M_b._M_p)->v_data != this) {
    if (this_00->v_debugger != (t_debugger *)0x0) {
      t_engine::f_debug_safe_region_enter(this_00);
    }
    local_28._M_device = &this_00->v_thread__mutex;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    local_28._M_owns = true;
    if (this->v_internal != (t_internal *)0x0) {
      do {
        std::condition_variable::wait((unique_lock *)&this_00->v_thread__condition);
      } while (this->v_internal != (t_internal *)0x0);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    t_safe_region::~t_safe_region(&local_29);
    return;
  }
  a_message_00._M_str = in_RDX;
  a_message_00._M_len = (size_t)L"engine thread can not be joined.";
  f_throw((xemmai *)0x20,a_message_00);
}

Assistant:

void t_thread::f_join()
{
	if (v_internal == v_current) f_throw(L"current thread can not be joined."sv);
	auto engine = f_engine();
	if (this == &engine->v_thread->f_as<t_thread>()) f_throw(L"engine thread can not be joined."sv);
	t_safe_region region;
	std::unique_lock lock(engine->v_thread__mutex);
	while (v_internal) engine->v_thread__condition.wait(lock);
}